

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterate.cc
# Opt level: O0

bool __thiscall ipx::Iterate::feasible(Iterate *this)

{
  undefined8 *in_RDI;
  double dVar1;
  double dVar2;
  bool is_feasible;
  bool dual_feasible;
  bool primal_feasible;
  double rel_dresidual;
  double rel_presidual;
  double costs_measure;
  double bounds_measure;
  undefined4 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd4;
  undefined1 in_stack_ffffffffffffffd5;
  undefined1 in_stack_ffffffffffffffd6;
  undefined1 in_stack_ffffffffffffffd7;
  
  Evaluate((Iterate *)
           CONCAT17(in_stack_ffffffffffffffd7,
                    CONCAT16(in_stack_ffffffffffffffd6,
                             CONCAT15(in_stack_ffffffffffffffd5,
                                      CONCAT14(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0))
                            )));
  dVar1 = Model::norm_bounds((Model *)*in_RDI);
  dVar2 = Model::norm_c((Model *)*in_RDI);
  return (double)in_RDI[0x1a] <= (double)in_RDI[0x22] * (dVar1 + 1.0) &&
         (double)in_RDI[0x1b] <= (double)in_RDI[0x22] * (dVar2 + 1.0);
}

Assistant:

bool Iterate::feasible() const {
    Evaluate();
    const double bounds_measure = 1.0 + model_.norm_bounds();
    const double costs_measure = 1.0 + model_.norm_c();
    const double rel_presidual = presidual_ / bounds_measure;
    const double rel_dresidual = dresidual_ / costs_measure;
    const bool primal_feasible = presidual_ <= feasibility_tol_ * (bounds_measure);
    const bool dual_feasible = dresidual_ <= feasibility_tol_ * (costs_measure);
    const bool is_feasible = primal_feasible && dual_feasible;
    if (kTerminationLogging) {
      printf("\nIterate::feasible presidual_ = %11.4g; bounds_measure = %11.4g; "
	     "rel_presidual = %11.4g; feasibility_tol = %11.4g: primal_feasible = %d\n",
	     presidual_, bounds_measure, rel_presidual, feasibility_tol_, primal_feasible);
      printf("Iterate::feasible dresidual_ = %11.4g;  costs_measure = %11.4g; "
	     "rel_dresidual = %11.4g; feasibility_tol = %11.4g:   dual_feasible = %d\n",
	     dresidual_, costs_measure, rel_dresidual, feasibility_tol_, dual_feasible);
    }
    return is_feasible;
}